

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  uint uVar1;
  LY_ERR *pLVar2;
  lyxp_node_type local_30;
  int local_2c;
  lyxp_node_type root_type;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  local_2c = options;
  _root_type = param_3;
  local_mod_local = (lys_module *)cur_node;
  cur_node_local = (lyd_node *)set;
  if ((((set->val).nodes)->type == LYXP_NODE_ATTR) ||
     ((((set->val).nodes)->node->validity & 0x80) == 0)) {
    moveto_get_root(cur_node,options,&local_30);
    uVar1 = *(uint *)&cur_node_local->attr->next;
    if (uVar1 < 2) {
      set_local = (lyxp_set *)cast_string_elem(cur_node_local->attr->parent,_root_type,1,local_30);
    }
    else if (uVar1 - 2 < 2) {
      set_local = (lyxp_set *)cast_string_elem(cur_node_local->attr->parent,_root_type,0,local_30);
    }
    else if (uVar1 == 4) {
      set_local = (lyxp_set *)strdup((char *)cur_node_local->attr->parent->prev);
    }
    else {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x221);
      set_local = (lyxp_set *)0x0;
    }
  }
  else {
    ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,((set->val).nodes)->node,
            ((set->val).nodes)->node->schema->name);
    set_local = (lyxp_set *)0x0;
  }
  return (char *)set_local;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        return strdup(set->val.attrs[0].attr->value_str);
    }

    LOGINT;
    return NULL;
}